

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu382.c
# Opt level: O0

MPP_RET hal_h265d_vdpu382_wait(void *hal,HalTaskInfo *task)

{
  RK_U32 RVar1;
  RK_U8 *pRVar2;
  MppFrame local_58;
  MppFrame frame_out;
  MppFrame frame_ref;
  MppFrame mframe;
  Vdpu382H265dRegSet *pVStack_38;
  RK_S32 i;
  Vdpu382H265dRegSet *hw_regs;
  RK_U8 *p;
  HalH265dCtx *reg_ctx;
  RK_S32 index;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  reg_ctx._4_4_ = MPP_OK;
  reg_ctx._0_4_ = (task->dec).reg_index;
  if (*(int *)((long)hal + 0x180) == 0) {
    pVStack_38 = *(Vdpu382H265dRegSet **)((long)hal + 0x100);
  }
  else {
    pVStack_38 = *(Vdpu382H265dRegSet **)((long)hal + (long)(int)reg_ctx * 0x28 + 0x128);
  }
  hw_regs = pVStack_38;
  p = (RK_U8 *)hal;
  _index = task;
  task_local = (HalTaskInfo *)hal;
  if ((((task->dec).flags.val >> 2 & 1) == 0) &&
     ((((task->dec).flags.val >> 3 & 1) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0))
     )) {
    reg_ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
    if (reg_ctx._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_h265d_vdpu382","poll cmd failed %d\n","hal_h265d_vdpu382_wait",
                 (ulong)(uint)reg_ctx._4_4_);
    }
  }
  else if ((hal_h265d_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_h265d_vdpu382","%s found task error\n",(char *)0x0,"hal_h265d_vdpu382_wait");
  }
  if (((((((_index->dec).flags.val >> 2 & 1) == 0) && (((_index->dec).flags.val >> 3 & 1) == 0)) &&
       (((uint)(pVStack_38->irq_status).reg224 >> 4 & 1) == 0)) &&
      ((((uint)(pVStack_38->irq_status).reg224 >> 6 & 1) == 0 &&
       (((uint)(pVStack_38->irq_status).reg224 >> 3 & 1) == 0)))) &&
     (((uint)(pVStack_38->irq_status).reg224 >> 2 & 1) != 0)) {
    if ((*(int *)(p + 0x180) != 0) && (*(int *)(p + 400) != 0)) {
      for (mframe._4_4_ = 0; (int)mframe._4_4_ < 0x11; mframe._4_4_ = mframe._4_4_ + 1) {
        if (-1 < *(int *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38)) {
          frame_out = (MppFrame)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)(p + 0x20),
                     *(RK_S32 *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38),SLOT_FRAME_PTR,
                     &frame_out);
          if ((hal_h265d_debug & 0x10) != 0) {
            _mpp_log_l(4,"hal_h265d_vdpu382","refer[%d] %d frame %p\n",(char *)0x0,
                       (ulong)mframe._4_4_,
                       (ulong)*(uint *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38),frame_out
                      );
          }
          if ((frame_out != (MppFrame)0x0) && (RVar1 = mpp_frame_get_errinfo(frame_out), RVar1 != 0)
             ) {
            local_58 = (MppFrame)0x0;
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)(p + 0x20),(_index->dec).output,SLOT_FRAME_PTR,&local_58);
            mpp_frame_set_errinfo(local_58,1);
            break;
          }
        }
      }
    }
  }
  else if (*(int *)(p + 0x180) == 0) {
    if (*(long *)(p + 0x188) != 0) {
      mpp_callback_f("hal_h265d_vdpu382_wait",*(MppCbCtx **)(p + 0x188),_index);
    }
  }
  else {
    frame_ref = (MppFrame)0x0;
    mpp_buf_slot_get_prop(*(MppBufSlots *)(p + 0x20),(_index->dec).output,SLOT_FRAME_PTR,&frame_ref)
    ;
    if (frame_ref != (MppFrame)0x0) {
      p[400] = '\x01';
      p[0x191] = '\0';
      p[0x192] = '\0';
      p[0x193] = '\0';
      mpp_frame_set_errinfo(frame_ref,1);
    }
  }
  for (mframe._4_4_ = 0; (int)mframe._4_4_ < 0x44; mframe._4_4_ = mframe._4_4_ + 1) {
    if ((mframe._4_4_ == 1) && ((hal_h265d_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h265d_vdpu382","RK_HEVC_DEC: regs[%02d]=%08X\n",(char *)0x0,1,
                 (ulong)(uint)(hw_regs->common).reg008);
    }
    if ((mframe._4_4_ == 0x2d) && ((hal_h265d_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_h265d_vdpu382","RK_HEVC_DEC: regs[%02d]=%08X\n",(char *)0x0,0x2d,
                 (ulong)(uint)(hw_regs->common).reg008);
    }
    hw_regs = (Vdpu382H265dRegSet *)&(hw_regs->common).reg009;
  }
  if (*(int *)(p + 0x180) != 0) {
    pRVar2 = p + (long)(int)reg_ctx * 0x28 + 0x108;
    pRVar2[0] = '\0';
    pRVar2[1] = '\0';
    pRVar2[2] = '\0';
    pRVar2[3] = '\0';
  }
  return reg_ctx._4_4_;
}

Assistant:

static MPP_RET hal_h265d_vdpu382_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_S32 index =  task->dec.reg_index;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    RK_U8* p = NULL;
    Vdpu382H265dRegSet *hw_regs = NULL;
    RK_S32 i;

    if (reg_ctx->fast_mode) {
        hw_regs = ( Vdpu382H265dRegSet *)reg_ctx->g_buf[index].hw_regs;
    } else {
        hw_regs = ( Vdpu382H265dRegSet *)reg_ctx->hw_regs;
    }

    p = (RK_U8*)hw_regs;

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        goto ERR_PROC;
    }

    ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

ERR_PROC:
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        hw_regs->irq_status.reg224.dec_error_sta ||
        hw_regs->irq_status.reg224.buf_empty_sta ||
        hw_regs->irq_status.reg224.dec_bus_sta ||
        !hw_regs->irq_status.reg224.dec_rdy_sta) {
        if (!reg_ctx->fast_mode) {
            if (reg_ctx->dec_cb)
                mpp_callback(reg_ctx->dec_cb, &task->dec);
        } else {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                  SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                reg_ctx->fast_mode_err_found = 1;
                mpp_frame_set_errinfo(mframe, 1);
            }
        }
    } else {
        if (reg_ctx->fast_mode && reg_ctx->fast_mode_err_found) {
            for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(task->dec.refer); i++) {
                if (task->dec.refer[i] >= 0) {
                    MppFrame frame_ref = NULL;

                    mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.refer[i],
                                          SLOT_FRAME_PTR, &frame_ref);
                    h265h_dbg(H265H_DBG_FAST_ERR, "refer[%d] %d frame %p\n",
                              i, task->dec.refer[i], frame_ref);
                    if (frame_ref && mpp_frame_get_errinfo(frame_ref)) {
                        MppFrame frame_out = NULL;
                        mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                              SLOT_FRAME_PTR, &frame_out);
                        mpp_frame_set_errinfo(frame_out, 1);
                        break;
                    }
                }
            }
        }
    }

    for (i = 0; i < 68; i++) {
        if (i == 1) {
            h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                      i, *((RK_U32*)p));
        }

        if (i == 45) {
            h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[%02d]=%08X\n",
                      i, *((RK_U32*)p));
        }
        p += 4;
    }

    if (reg_ctx->fast_mode) {
        reg_ctx->g_buf[index].use_flag = 0;
    }

    return ret;
}